

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_table.cc
# Opt level: O0

bool __thiscall draco::CornerTable::ComputeVertexCorners(CornerTable *this,int num_vertices)

{
  uint value;
  bool bVar1;
  reference pvVar2;
  reference this_00;
  uint in_ESI;
  long in_RDI;
  reference rVar3;
  reference rVar4;
  reference rVar5;
  iterator iVar6;
  reference rVar7;
  bool visited;
  iterator __end1;
  iterator __begin1;
  vector<bool,_std::allocator<bool>_> *__range1;
  CornerIndex act_c;
  bool is_non_manifold_vertex;
  VertexIndex v;
  CornerIndex c;
  int k;
  CornerIndex first_face_corner;
  FaceIndex f;
  vector<bool,_std::allocator<bool>_> visited_corners;
  vector<bool,_std::allocator<bool>_> visited_vertices;
  CornerTable *in_stack_fffffffffffffd78;
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>
  *in_stack_fffffffffffffd80;
  CornerTable *in_stack_fffffffffffffd88;
  CornerIndex in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  reference in_stack_fffffffffffffd98;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffda0;
  vector<bool,_std::allocator<bool>_> *this_01;
  _Bit_type *in_stack_fffffffffffffda8;
  FaceIndex in_stack_fffffffffffffdb0;
  _Bit_type in_stack_fffffffffffffdd8;
  _Bit_type *in_stack_fffffffffffffde0;
  reference local_180;
  undefined1 local_169;
  _Bit_type *local_168;
  uint local_160;
  _Bit_type *local_158;
  uint local_150;
  _Bit_type *local_148;
  uint local_140;
  _Bit_type *local_138;
  uint local_130;
  vector<bool,_std::allocator<bool>_> *local_128;
  uint local_120;
  ThisIndexType local_11c;
  reference local_118;
  uint local_108;
  ThisIndexType local_104;
  uint local_100;
  ThisIndexType local_fc;
  reference local_f8;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_e4;
  reference local_e0;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_cc;
  reference local_c8;
  byte local_b5;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_b4;
  reference local_b0;
  int local_9c;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_98;
  int local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> local_80;
  undefined1 local_79;
  undefined1 local_39;
  vector<bool,_std::allocator<bool>_> local_38;
  uint local_c;
  
  *(uint *)(in_RDI + 0x48) = in_ESI;
  local_c = in_ESI;
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>
  ::resize(in_stack_fffffffffffffd80,(size_t)in_stack_fffffffffffffd78,
           (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)0x1b37b8);
  local_39 = 0;
  std::allocator<bool>::allocator((allocator<bool> *)0x1b37e5);
  std::vector<bool,_std::allocator<bool>_>::vector
            (in_stack_fffffffffffffda0,(size_type)in_stack_fffffffffffffd98,
             (bool *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90.value_),
             (allocator_type *)in_stack_fffffffffffffd88);
  std::allocator<bool>::~allocator((allocator<bool> *)0x1b3819);
  num_corners((CornerTable *)0x1b3826);
  local_79 = 0;
  std::allocator<bool>::allocator((allocator<bool> *)0x1b385d);
  std::vector<bool,_std::allocator<bool>_>::vector
            (in_stack_fffffffffffffda0,(size_type)in_stack_fffffffffffffd98,
             (bool *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90.value_),
             (allocator_type *)in_stack_fffffffffffffd88);
  std::allocator<bool>::~allocator((allocator<bool> *)0x1b3891);
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::IndexType(&local_80,0);
  rVar4._M_mask = in_stack_fffffffffffffdd8;
  rVar4._M_p = in_stack_fffffffffffffde0;
  rVar5._M_mask = (_Bit_type)in_stack_fffffffffffffda0;
  rVar5._M_p = in_stack_fffffffffffffda8;
  do {
    local_84 = num_faces((CornerTable *)0x1b38b1);
    bVar1 = IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::operator<(&local_80,&local_84);
    if (!bVar1) {
      *(undefined4 *)(in_RDI + 0x50) = 0;
      local_128 = &local_38;
      iVar6 = std::vector<bool,_std::allocator<bool>_>::begin
                        ((vector<bool,_std::allocator<bool>_> *)0x1b3fc1);
      local_148 = iVar6.super__Bit_iterator_base._M_p;
      local_140 = iVar6.super__Bit_iterator_base._M_offset;
      local_138 = local_148;
      local_130 = local_140;
      iVar6 = std::vector<bool,_std::allocator<bool>_>::end(local_128);
      rVar7._M_mask = (_Bit_type)in_stack_fffffffffffffd80;
      rVar7._M_p = (_Bit_type *)in_stack_fffffffffffffd88;
      local_168 = iVar6.super__Bit_iterator_base._M_p;
      local_160 = iVar6.super__Bit_iterator_base._M_offset;
      local_158 = local_168;
      local_150 = local_160;
      while( true ) {
        bVar1 = std::operator!=((_Bit_iterator_base *)rVar7._M_mask,
                                (_Bit_iterator_base *)in_stack_fffffffffffffd78);
        if (!bVar1) break;
        rVar7 = std::_Bit_iterator::operator*((_Bit_iterator *)0x1b405a);
        local_180 = rVar7;
        local_169 = std::_Bit_reference::operator_cast_to_bool(&local_180);
        if (!(bool)local_169) {
          *(int *)(in_RDI + 0x50) = *(int *)(in_RDI + 0x50) + 1;
        }
        std::_Bit_iterator::operator++((_Bit_iterator *)rVar7._M_mask);
      }
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)0x1b40d4);
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)0x1b40e1);
      return true;
    }
    local_8c = local_80.value_;
    local_88 = (uint)FirstCorner(in_stack_fffffffffffffd78,
                                 (FaceIndex)(uint)in_stack_fffffffffffffd80);
    local_90 = local_80.value_;
    bVar1 = IsDegenerated((CornerTable *)rVar5._M_p,in_stack_fffffffffffffdb0);
    if (!bVar1) {
      for (local_94 = 0; local_94 < 3; local_94 = local_94 + 1) {
        local_9c = local_94;
        local_98.value_ =
             (uint)IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator+
                             ((IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                              in_stack_fffffffffffffd78,(uint *)0x1b3a36);
        IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::value(&local_98);
        rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)rVar5._M_mask,
                           (size_type)in_stack_fffffffffffffd98);
        local_b0 = rVar3;
        bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_b0);
        if (!bVar1) {
          pvVar2 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
                   ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
                                 *)in_stack_fffffffffffffd80,
                                (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                                in_stack_fffffffffffffd78);
          local_b4.value_ = pvVar2->value_;
          local_b5 = 0;
          IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_b4);
          rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            ((vector<bool,_std::allocator<bool>_> *)rVar5._M_mask,
                             (size_type)in_stack_fffffffffffffd98);
          local_c8 = rVar3;
          bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_c8);
          if (bVar1) {
            IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>
            ::push_back(in_stack_fffffffffffffd80,
                        (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                        in_stack_fffffffffffffd78);
            IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
            ::push_back((IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
                         *)in_stack_fffffffffffffd80,
                        (IndexType<unsigned_int,_draco::VertexIndex_tag_type_> *)
                        in_stack_fffffffffffffd78);
            std::vector<bool,_std::allocator<bool>_>::push_back
                      ((vector<bool,_std::allocator<bool>_> *)rVar4._M_p,rVar4._M_mask._7_1_);
            value = local_c;
            local_c = local_c + 1;
            IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::IndexType(&local_cc,value);
            IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator=(&local_b4,&local_cc);
            local_b5 = 1;
          }
          IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_b4);
          rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            ((vector<bool,_std::allocator<bool>_> *)rVar5._M_mask,
                             (size_type)in_stack_fffffffffffffd98);
          local_e0 = rVar3;
          std::_Bit_reference::operator=(&local_e0,true);
          local_e4.value_ = local_98.value_;
          do {
            bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator!=
                              (&local_e4,
                               (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                               &kInvalidCornerIndex);
            if (!bVar1) break;
            IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::value(&local_e4);
            rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                              ((vector<bool,_std::allocator<bool>_> *)rVar5._M_mask,
                               (size_type)in_stack_fffffffffffffd98);
            local_f8 = rVar4;
            std::_Bit_reference::operator=(&local_f8,true);
            this_00 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>
                      ::operator[](in_stack_fffffffffffffd80,
                                   (IndexType<unsigned_int,_draco::VertexIndex_tag_type_> *)
                                   in_stack_fffffffffffffd78);
            IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(this_00,&local_e4);
            if ((local_b5 & 1) != 0) {
              pvVar2 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
                       ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
                                     *)in_stack_fffffffffffffd80,
                                    (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                                    in_stack_fffffffffffffd78);
              IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator=(pvVar2,&local_b4);
            }
            local_100 = local_e4.value_;
            local_fc.value_ = (uint)SwingLeft(in_stack_fffffffffffffd88,in_stack_fffffffffffffd90);
            IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_e4,&local_fc);
            bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator==
                              (&local_e4,&local_98);
          } while (!bVar1);
          bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator==
                            (&local_e4,
                             (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                             &kInvalidCornerIndex);
          if (bVar1) {
            local_108 = local_98.value_;
            local_104.value_ = (uint)SwingRight(in_stack_fffffffffffffd88,in_stack_fffffffffffffd90)
            ;
            IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_e4,&local_104);
            while( true ) {
              bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator!=
                                (&local_e4,
                                 (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                                 &kInvalidCornerIndex);
              this_01 = (vector<bool,_std::allocator<bool>_> *)rVar5._M_mask;
              if (!bVar1) break;
              IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::value(&local_e4);
              rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                (this_01,(size_type)in_stack_fffffffffffffd98);
              local_118 = rVar5;
              std::_Bit_reference::operator=(&local_118,true);
              if ((local_b5 & 1) != 0) {
                in_stack_fffffffffffffd98 =
                     IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
                     ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
                                   *)in_stack_fffffffffffffd80,
                                  (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                                  in_stack_fffffffffffffd78);
                IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator=
                          (in_stack_fffffffffffffd98,&local_b4);
              }
              local_120 = local_e4.value_;
              local_11c.value_ =
                   (uint)SwingRight(in_stack_fffffffffffffd88,in_stack_fffffffffffffd90);
              IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_e4,&local_11c)
              ;
            }
          }
        }
      }
    }
    IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::operator++(&local_80);
  } while( true );
}

Assistant:

bool CornerTable::ComputeVertexCorners(int num_vertices) {
  DRACO_DCHECK(GetValenceCache().IsCacheEmpty());
  num_original_vertices_ = num_vertices;
  vertex_corners_.resize(num_vertices, kInvalidCornerIndex);
  // Arrays for marking visited vertices and corners that allow us to detect
  // non-manifold vertices.
  std::vector<bool> visited_vertices(num_vertices, false);
  std::vector<bool> visited_corners(num_corners(), false);

  for (FaceIndex f(0); f < num_faces(); ++f) {
    const CornerIndex first_face_corner = FirstCorner(f);
    // Check whether the face is degenerated. If so ignore it.
    if (IsDegenerated(f)) {
      continue;
    }

    for (int k = 0; k < 3; ++k) {
      const CornerIndex c = first_face_corner + k;
      if (visited_corners[c.value()]) {
        continue;
      }
      VertexIndex v = corner_to_vertex_map_[c];
      // Note that one vertex maps to many corners, but we just keep track
      // of the vertex which has a boundary on the left if the vertex lies on
      // the boundary. This means that all the related corners can be accessed
      // by iterating over the SwingRight() operator.
      // In case of a vertex inside the mesh, the choice is arbitrary.
      bool is_non_manifold_vertex = false;
      if (visited_vertices[v.value()]) {
        // A visited vertex of an unvisited corner found. Must be a non-manifold
        // vertex.
        // Create a new vertex for it.
        vertex_corners_.push_back(kInvalidCornerIndex);
        non_manifold_vertex_parents_.push_back(v);
        visited_vertices.push_back(false);
        v = VertexIndex(num_vertices++);
        is_non_manifold_vertex = true;
      }
      // Mark the vertex as visited.
      visited_vertices[v.value()] = true;

      // First swing all the way to the left and mark all corners on the way.
      CornerIndex act_c(c);
      while (act_c != kInvalidCornerIndex) {
        visited_corners[act_c.value()] = true;
        // Vertex will eventually point to the left most corner.
        vertex_corners_[v] = act_c;
        if (is_non_manifold_vertex) {
          // Update vertex index in the corresponding face.
          corner_to_vertex_map_[act_c] = v;
        }
        act_c = SwingLeft(act_c);
        if (act_c == c) {
          break;  // Full circle reached.
        }
      }
      if (act_c == kInvalidCornerIndex) {
        // If we have reached an open boundary we need to swing right from the
        // initial corner to mark all corners in the opposite direction.
        act_c = SwingRight(c);
        while (act_c != kInvalidCornerIndex) {
          visited_corners[act_c.value()] = true;
          if (is_non_manifold_vertex) {
            // Update vertex index in the corresponding face.
            corner_to_vertex_map_[act_c] = v;
          }
          act_c = SwingRight(act_c);
        }
      }
    }
  }

  // Count the number of isolated (unprocessed) vertices.
  num_isolated_vertices_ = 0;
  for (bool visited : visited_vertices) {
    if (!visited) {
      ++num_isolated_vertices_;
    }
  }
  return true;
}